

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

bool __thiscall
Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::Set
          (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this,AuxPointerType e,
          void *p)

{
  Type TVar1;
  uint8 u;
  void *p_local;
  AuxPointerType e_local;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this_local;
  
  if (this->offsets[e] == 0xff) {
    if (this->count == this->capacity) {
      this_local._7_1_ = false;
    }
    else {
      TVar1 = this->count;
      this->count = TVar1 + '\x01';
      this->offsets[e] = TVar1;
      Memory::WriteBarrierPtr<void>::operator=(this->ptrs + this->offsets[e],p);
      this_local._7_1_ = true;
    }
  }
  else {
    Memory::WriteBarrierPtr<void>::operator=(this->ptrs + this->offsets[e],p);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool AuxPtrs<T, FieldsEnum>::Set(FieldsEnum e, void* p)
    {
        uint8 u = (uint8)e;
        if (offsets[u] != (uint8)FieldsEnum::Invalid)
        {
            ptrs[offsets[u]] = p;
            return true;
        }
        else
        {
            if (count == capacity)
            {
                // need to expand
                return false;
            }
            else
            {
                offsets[u] = count++;
                ptrs[(uint8)offsets[u]] = p;
                return true;
            }
        }
    }